

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_vorbis.h
# Opt level: O3

uint32 get_bits(vorb *f,int n)

{
  uint32 uVar1;
  uint32 uVar2;
  int iVar3;
  
  iVar3 = f->valid_bits;
  uVar1 = 0;
  if (-1 < iVar3) {
    if (iVar3 < n) {
      if (0x18 < (uint)n) {
        uVar1 = get_bits(f,0x18);
        uVar2 = get_bits(f,n + -0x18);
        return uVar2 * 0x1000000 + uVar1;
      }
      if (iVar3 == 0) {
        f->acc = 0;
      }
      do {
        iVar3 = get8_packet_raw(f);
        if (iVar3 == -1) {
          f->valid_bits = -1;
          return 0;
        }
        f->acc = f->acc + (iVar3 << ((byte)f->valid_bits & 0x1f));
        iVar3 = f->valid_bits + 8;
        f->valid_bits = iVar3;
      } while (iVar3 < n);
    }
    uVar1 = ~(-1 << ((byte)n & 0x1f)) & f->acc;
    f->acc = f->acc >> ((byte)n & 0x1f);
    f->valid_bits = iVar3 - n;
  }
  return uVar1;
}

Assistant:

static uint32 get_bits(vorb *f, int n)
{
   uint32 z;

   if (f->valid_bits < 0) return 0;
   if (f->valid_bits < n) {
      if (n > 24) {
         // the accumulator technique below would not work correctly in this case
         z = get_bits(f, 24);
         z += get_bits(f, n-24) << 24;
         return z;
      }
      if (f->valid_bits == 0) f->acc = 0;
      while (f->valid_bits < n) {
         int z = get8_packet_raw(f);
         if (z == EOP) {
            f->valid_bits = INVALID_BITS;
            return 0;
         }
         f->acc += z << f->valid_bits;
         f->valid_bits += 8;
      }
   }

   assert(f->valid_bits >= n);
   z = f->acc & ((1 << n)-1);
   f->acc >>= n;
   f->valid_bits -= n;
   return z;
}